

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadePrimitives
          (BuiltinVariableShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  long lVar1;
  int iVar2;
  anon_union_16_3_1194ccdc_for_v *varyings;
  anon_union_16_3_1194ccdc_for_v *this_00;
  Vector<float,_4> *pVVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  anon_union_16_3_1194ccdc_for_v local_f8;
  Vector<float,_4> local_e8;
  anon_union_16_3_1194ccdc_for_v local_d8;
  ulong local_c8;
  BuiltinVariableShader *local_c0;
  Vec4 colors [4];
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 1.0;
  local_68.m_data[3] = 1.0;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  local_c0 = this;
  tcu::Vector<float,_4>::Vector(colors,&local_48);
  tcu::Vector<float,_4>::Vector(colors + 1,&local_58);
  tcu::Vector<float,_4>::Vector(colors + 2,&local_68);
  tcu::Vector<float,_4>::Vector(colors + 3,&local_78);
  uVar4 = 0;
  uVar5 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar5 = uVar4;
  }
  uVar5 = uVar5 * 0x38;
  local_c8 = uVar5;
  do {
    if (uVar5 == uVar4) {
      return;
    }
    lVar1 = *(long *)((long)packets->vertices + uVar4);
    iVar2 = *(int *)&(local_c0->super_ShaderProgram).field_0x154;
    if (iVar2 == 2) {
      varyings = (anon_union_16_3_1194ccdc_for_v *)(lVar1 + 0x20);
      fVar6 = floorf(*(float *)(lVar1 + 0x20));
      iVar2 = (int)fVar6 + 3;
      pVVar3 = (Vector<float,_4> *)(lVar1 + 8);
      local_f8._0_8_ = 0x3d4ccccd;
      local_f8._8_8_ = 0;
      this_00 = &local_d8;
      tcu::operator+((tcu *)this_00,pVVar3,(Vector<float,_4> *)&local_f8);
      rr::GeometryEmitter::EmitVertex(output,(Vec4 *)this_00,1.0,(GenericVec4 *)varyings,iVar2);
      local_f8._0_8_ = 0x3d4ccccd;
      local_f8._8_8_ = 0;
      tcu::operator-((tcu *)this_00,pVVar3,(Vector<float,_4> *)&local_f8);
      rr::GeometryEmitter::EmitVertex(output,(Vec4 *)this_00,1.0,(GenericVec4 *)varyings,iVar2);
      local_f8._0_8_ = 0x3d4ccccd00000000;
      local_f8._8_8_ = 0;
      tcu::operator+((tcu *)this_00,pVVar3,(Vector<float,_4> *)&local_f8);
      fVar6 = 1.0;
      uVar5 = local_c8;
LAB_011f3180:
      rr::GeometryEmitter::EmitVertex(output,(Vec4 *)this_00,fVar6,(GenericVec4 *)varyings,iVar2);
    }
    else {
      if (iVar2 == 1) {
        iVar2 = *(int *)((long)packets->vertices + (uVar4 - 8)) % 4;
        local_d8._0_8_ = *(undefined8 *)colors[iVar2].m_data;
        local_d8._8_8_ = *(undefined8 *)(colors[iVar2].m_data + 2);
        pVVar3 = (Vector<float,_4> *)(lVar1 + 8);
        local_e8.m_data[0] = 0.05;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        this_00 = &local_f8;
        tcu::operator+((tcu *)this_00,pVVar3,&local_e8);
        varyings = &local_d8;
        rr::GeometryEmitter::EmitVertex
                  (output,(Vec4 *)this_00,1.0,(GenericVec4 *)varyings,
                   *(int *)((long)packets->vertices + (uVar4 - 8)));
        local_e8.m_data[0] = 0.05;
        local_e8.m_data[1] = 0.0;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        tcu::operator-((tcu *)this_00,pVVar3,&local_e8);
        rr::GeometryEmitter::EmitVertex
                  (output,(Vec4 *)this_00,1.0,(GenericVec4 *)varyings,
                   *(int *)((long)packets->vertices + (uVar4 - 8)));
        local_e8.m_data[0] = 0.0;
        local_e8.m_data[1] = 0.05;
        local_e8.m_data[2] = 0.0;
        local_e8.m_data[3] = 0.0;
        tcu::operator+((tcu *)this_00,pVVar3,&local_e8);
        iVar2 = *(int *)((long)packets->vertices + (uVar4 - 8));
        fVar6 = 1.0;
        goto LAB_011f3180;
      }
      if (iVar2 == 0) {
        fVar6 = *(float *)(lVar1 + 0x20) + 1.0;
        local_d8._0_8_ = 0x3f8000003f800000;
        local_d8._8_8_ = 0x3f8000003f800000;
        this_00 = (anon_union_16_3_1194ccdc_for_v *)(lVar1 + 8);
        iVar2 = *(int *)((long)packets->vertices + (uVar4 - 8));
        varyings = &local_d8;
        goto LAB_011f3180;
      }
    }
    rr::GeometryEmitter::EndPrimitive(output);
    uVar4 = uVar4 + 0x38;
  } while( true );
}

Assistant:

void BuiltinVariableShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex = packets[packetNdx].vertices[0];

		if (m_test == TEST_POINT_SIZE)
		{
			rr::GenericVec4	fragColor;
			const float		pointSize = vertex->outputs[0].get<float>().x() + 1.0f;

			fragColor = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			output.EmitVertex(vertex->position, pointSize, &fragColor, packets[packetNdx].primitiveIDIn);
		}
		else if (m_test == TEST_PRIMITIVE_ID_IN)
		{
			rr::GenericVec4	fragColor;
			fragColor = colors[packets[packetNdx].primitiveIDIn % 4];

			output.EmitVertex(vertex->position + tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position - tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(0.0f,  0.05f, 0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}
		else if (m_test == TEST_PRIMITIVE_ID)
		{
			const int primitiveID = (int)deFloatFloor(vertex->outputs[0].get<float>().x()) + 3;

			output.EmitVertex(vertex->position + tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
			output.EmitVertex(vertex->position - tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
			output.EmitVertex(vertex->position + tcu::Vec4(0.0f,  0.05f, 0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
		}
		else
			DE_ASSERT(DE_FALSE);

		output.EndPrimitive();
	}
}